

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall
QString::rightJustified
          (QString *__return_storage_ptr__,QString *this,qsizetype width,QChar fill,bool truncate)

{
  long lVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  long lVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  lVar1 = (this->d).size;
  if (lVar1 < width) {
    resize(__return_storage_ptr__,width);
    pcVar2 = (__return_storage_ptr__->d).ptr;
    for (lVar5 = 0; width - lVar1 != lVar5; lVar5 = lVar5 + 1) {
      pcVar2[lVar5] = fill.ucs;
    }
    if (lVar1 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        memcpy(pcVar2 + lVar5,(this->d).ptr,lVar1 * 2);
        return __return_storage_ptr__;
      }
      goto LAB_002f46ae;
    }
  }
  else {
    if (!truncate) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QArrayDataPointer<char16_t>::operator=(&__return_storage_ptr__->d,&this->d);
        return __return_storage_ptr__;
      }
      goto LAB_002f46ae;
    }
    left((QString *)&local_48,this,width);
    pDVar4 = (__return_storage_ptr__->d).d;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_48.d;
    (__return_storage_ptr__->d).ptr = local_48.ptr;
    qVar3 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_48.size;
    local_48.d = pDVar4;
    local_48.ptr = pcVar2;
    local_48.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_002f46ae:
  __stack_chk_fail();
}

Assistant:

QString QString::rightJustified(qsizetype width, QChar fill, bool truncate) const
{
    QString result;
    qsizetype len = size();
    qsizetype padlen = width - len;
    if (padlen > 0) {
        result.resize(len+padlen);
        QChar *uc = (QChar*)result.d.data();
        while (padlen--)
           * uc++ = fill;
        if (len)
          memcpy(static_cast<void *>(uc), static_cast<const void *>(d.data()), sizeof(QChar)*len);
    } else {
        if (truncate)
            result = left(width);
        else
            result = *this;
    }
    return result;
}